

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.cpp
# Opt level: O1

bool SendInt(int socket,int number)

{
  long lVar1;
  size_t __n;
  bool bVar2;
  undefined1 local_24 [4];
  
  __n = 4;
  lVar1 = write(socket,local_24,4);
  if (lVar1 < 1) {
    bVar2 = false;
  }
  else {
    do {
      __n = __n - lVar1;
      bVar2 = __n == 0;
      if (bVar2) {
        return bVar2;
      }
      lVar1 = write(socket,&stack0xffffffffffffffe0 + -__n,__n);
    } while (0 < lVar1);
  }
  return bVar2;
}

Assistant:

bool SendInt(int socket, int number)
{
    char * data = (char*)&number;
    size_t left = sizeof(number);
    ssize_t rc;

    while (left)
    {
        rc = write(socket, data + sizeof(number) - left, left);
        if(rc <= 0) return false;
        left -= rc;
    }

    return true;
}